

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> *
make_word<signed_char,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
          (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
           *__return_storage_ptr__,size_t length,char delim)

{
  initializer_list<signed_char> __l;
  allocator<signed_char> local_52;
  char local_51;
  iterator local_50;
  size_type local_48;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_40;
  char local_19;
  size_t sStack_18;
  char delim_local;
  size_t length_local;
  
  local_50 = &local_51;
  local_48 = 1;
  local_51 = delim;
  local_19 = delim;
  sStack_18 = length;
  length_local = (size_t)__return_storage_ptr__;
  std::allocator<signed_char>::allocator(&local_52);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  basic_string(&local_40,__l,&local_52);
  make_word<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            (__return_storage_ptr__,&local_40,sStack_18);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  ~basic_string(&local_40);
  std::allocator<signed_char>::~allocator(&local_52);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}